

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

void google::protobuf::internal::
     AssertDownCast<google::protobuf::DescriptorPool::MemoData<std::vector<unsigned_int,std::allocator<unsigned_int>>>const,google::protobuf::DescriptorPool::MemoBase>
               (MemoBase *from)

{
  bool bVar1;
  long local_28;
  MemoBase *from_local;
  
  bVar1 = true;
  if (from != (MemoBase *)0x0) {
    if (from == (MemoBase *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = __dynamic_cast(from,&DescriptorPool::MemoBase::typeinfo,
                                &DescriptorPool::
                                 MemoData<std::vector<unsigned_int,std::allocator<unsigned_int>>>::
                                 typeinfo,0);
    }
    bVar1 = local_28 != 0;
  }
  if (!bVar1) {
    __assert_fail("from == nullptr || dynamic_cast<To*>(from) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/port.h"
                  ,0xbf,
                  "void google::protobuf::internal::AssertDownCast(From *) [To = const google::protobuf::DescriptorPool::MemoData<std::vector<unsigned int>>, From = google::protobuf::DescriptorPool::MemoBase]"
                 );
  }
  return;
}

Assistant:

void AssertDownCast(From* from) {
  static_assert(std::is_base_of<From, To>::value, "illegal DownCast");

  // Check that this function is not used to downcast message types.
  // For those we should use {Down,Dynamic}CastTo{Message,Generated}.
  static_assert(!std::is_base_of_v<MessageLite, To>);

#if PROTOBUF_RTTI
  // RTTI: debug mode only!
  assert(from == nullptr || dynamic_cast<To*>(from) != nullptr);
#endif
}